

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O1

int __thiscall Hes_Emu::cpu_read_(Hes_Emu *this,hes_addr_t addr)

{
  state_t *psVar1;
  uint uVar2;
  int present;
  
  psVar1 = (this->super_Hes_Cpu).state;
  present = psVar1->base + psVar1->time;
  uVar2 = addr & 0x1fff;
  if (uVar2 < 0xc00) {
    if (uVar2 - 2 < 2) {
      return 0;
    }
    if (uVar2 == 0) {
      if (present < (this->irq).vdp) {
        return 0;
      }
      (this->irq).vdp = 0x40000000;
      run_until(this,present);
      irq_changed(this);
      return 0x20;
    }
  }
  else {
    if (uVar2 - 0xc00 < 2) {
      run_until(this,present);
      return ((this->timer).count - 1U) / (uint)this->timer_base;
    }
    if (uVar2 == 0x1402) {
      return (uint)(this->irq).disables;
    }
    if (uVar2 == 0x1403) {
      uVar2 = (uint)((this->irq).timer <= present);
      if ((this->irq).vdp <= present) {
        return uVar2 * 4 + 2;
      }
      return uVar2 * 4;
    }
  }
  return 0xff;
}

Assistant:

int Hes_Emu::cpu_read_( hes_addr_t addr )
{
	hes_time_t time = this->time();
	addr &= page_size - 1;
	switch ( addr )
	{
	case 0x0000:
		if ( irq.vdp > time )
			return 0;
		irq.vdp = future_hes_time;
		run_until( time );
		irq_changed();
		return 0x20;
		
	case 0x0002:
	case 0x0003:
		debug_printf( "VDP read not supported: %d\n", addr );
		return 0;
	
	case 0x0C01:
		//return timer.enabled; // TODO: remove?
	case 0x0C00:
		run_until( time );
		debug_printf( "Timer count read\n" );
		return (unsigned) (timer.count - 1) / timer_base;
	
	case 0x1402:
		return irq.disables;
	
	case 0x1403:
		{
			int status = 0;
			if ( irq.timer <= time ) status |= timer_mask;
			if ( irq.vdp   <= time ) status |= vdp_mask;
			return status;
		}
		
	#ifndef NDEBUG
		case 0x1000: // I/O port
		case 0x180C: // CD-ROM
		case 0x180D:
			break;
		
		default:
			debug_printf( "unmapped read  $%04X\n", addr );
	#endif
	}
	
	return unmapped;
}